

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbif.cpp
# Opt level: O0

void CVmBif::get_str_val_buf(char *buf,size_t buflen,vm_val_t *val)

{
  char *pcVar1;
  vm_val_t *in_RDX;
  size_t in_RSI;
  char *in_RDI;
  size_t copy_len;
  char *strp;
  size_t local_28;
  
  pcVar1 = get_str_val(in_RDX);
  local_28 = vmb_get_len((char *)0x2f48bc);
  if (in_RSI - 1 < local_28) {
    local_28 = utf8_ptr::s_trunc(in_RDI,in_RSI);
  }
  memcpy(in_RDI,pcVar1 + 2,local_28);
  in_RDI[local_28] = '\0';
  return;
}

Assistant:

void CVmBif::get_str_val_buf(VMG_ char *buf, size_t buflen,
                             const vm_val_t *val)
{
    /* pop the string value */
    const char *strp = get_str_val(vmg_ val);

    /* 
     *   get the length, but limit it to our buffer size, less one byte
     *   for null termination 
     */
    size_t copy_len = vmb_get_len(strp);
    if (copy_len > buflen - 1)
        copy_len = utf8_ptr::s_trunc(strp + VMB_LEN, buflen - 1);

    /* copy the string */
    memcpy(buf, strp + VMB_LEN, copy_len);

    /* null-terminate the result */
    buf[copy_len] = '\0';
}